

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite_cte_scan.cpp
# Opt level: O3

void __thiscall duckdb::RewriteCTEScan::VisitOperator(RewriteCTEScan *this,LogicalOperator *op)

{
  pointer pCVar1;
  LogicalCTERef *pLVar2;
  pointer pCVar3;
  CorrelatedColumnInfo *c;
  pointer pCVar4;
  
  if ((op->type == LOGICAL_CTE_REF) &&
     (pLVar2 = LogicalOperator::Cast<duckdb::LogicalCTERef>(op),
     pLVar2->cte_index == this->table_index)) {
    pCVar3 = (this->correlated_columns->
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ).
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (this->correlated_columns->
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ).
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar4 = pCVar3;
    if (pCVar3 != pCVar1) {
      do {
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   &pLVar2->chunk_types,&pCVar3->type);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&pLVar2->bound_columns,&pCVar3->name);
        pCVar3 = pCVar3 + 1;
      } while (pCVar3 != pCVar1);
      pCVar3 = (this->correlated_columns->
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ).
               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pCVar4 = (this->correlated_columns->
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ).
               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pLVar2->correlated_columns =
         pLVar2->correlated_columns + ((long)pCVar3 - (long)pCVar4 >> 4) * -0x3333333333333333;
  }
  LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
  return;
}

Assistant:

void RewriteCTEScan::VisitOperator(LogicalOperator &op) {
	if (op.type == LogicalOperatorType::LOGICAL_CTE_REF) {
		auto &cteref = op.Cast<LogicalCTERef>();

		if (cteref.cte_index == table_index) {
			for (auto &c : this->correlated_columns) {
				cteref.chunk_types.push_back(c.type);
				cteref.bound_columns.push_back(c.name);
			}
			cteref.correlated_columns += correlated_columns.size();
		}
	}
	VisitOperatorChildren(op);
}